

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cc
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
wabt::Opcode::GetBytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          Opcode *this)

{
  Enum EVar1;
  uint32_t prefix_code;
  uint uVar2;
  ulong uVar3;
  Offset OVar4;
  uint32_t value;
  uint8_t local_1f [5];
  uchar local_1a;
  uchar local_19 [2];
  uint8_t buffer [5];
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = (ulong)this->enum_;
  if (uVar3 < 0x19a) {
    local_1a = infos_[uVar3 * 0x28 + 0x1c];
    if (local_1a != '\0') {
LAB_00f4c61a:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (__return_storage_ptr__,(iterator)0x0,&local_1a);
      EVar1 = this->enum_;
      if ((ulong)EVar1 < 0x19a) {
        value = *(uint32_t *)(infos_ + (ulong)EVar1 * 0x28 + 0x20);
      }
      else {
        value = -EVar1 & 0xff;
      }
      OVar4 = WriteU32Leb128Raw(local_1f,&local_1a,value);
      if (OVar4 != 0) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   (__return_storage_ptr__->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish,local_1f,local_1f + OVar4);
        return __return_storage_ptr__;
      }
      __assert_fail("length != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/opcode.cc"
                    ,0x16c,"std::vector<uint8_t> wabt::Opcode::GetBytes() const");
    }
    uVar2 = *(uint *)(infos_ + uVar3 * 0x28 + 0x20);
  }
  else {
    uVar2 = -this->enum_;
    if ((uVar2 & 0xff00) != 0) {
      local_1a = (uchar)(uVar2 >> 8);
      goto LAB_00f4c61a;
    }
  }
  local_19[0] = (uchar)uVar2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
            (__return_storage_ptr__,(iterator)0x0,local_19);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> Opcode::GetBytes() const {
  std::vector<uint8_t> result;
  if (HasPrefix()) {
    result.push_back(GetPrefix());
    uint8_t buffer[5];
    Offset length =
        WriteU32Leb128Raw(buffer, buffer + sizeof(buffer), GetCode());
    assert(length != 0);
    result.insert(result.end(), buffer, buffer + length);
  } else {
    result.push_back(GetCode());
  }
  return result;
}